

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeValue(BuiltStyledStreamWriter *this,Value *value)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  char *value_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  bool value_01;
  LargestInt value_02;
  LargestUInt value_03;
  PrecisionType in_R8D;
  double value_04;
  allocator local_1d1;
  String local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  String local_1a8;
  Value *local_188;
  Value *childValue;
  String *name;
  iterator it;
  String local_168;
  allocator local_141;
  String local_140;
  undefined1 local_120 [8];
  Members members;
  allocator local_e1;
  String local_e0;
  String local_c0;
  undefined1 local_99;
  char *pcStack_98;
  bool ok;
  char *end;
  char *str;
  String local_68;
  String local_38;
  Value *local_18;
  Value *value_local;
  BuiltStyledStreamWriter *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  VVar2 = Value::type(value);
  switch(VVar2) {
  case nullValue:
    pushValue(this,&this->nullSymbol_);
    break;
  case intValue:
    pJVar3 = (Json *)Value::asLargestInt(local_18);
    valueToString_abi_cxx11_(&local_38,pJVar3,value_02);
    pushValue(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(local_18);
    valueToString_abi_cxx11_(&local_68,pJVar3,value_03);
    pushValue(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    break;
  case realValue:
    value_04 = Value::asDouble(local_18);
    (anonymous_namespace)::valueToString_abi_cxx11_
              ((String *)&str,(_anonymous_namespace_ *)(ulong)((byte)this->field_0xd8 >> 2 & 1),
               value_04,SUB41(this->precision_,0),this->precisionType_,in_R8D);
    pushValue(this,(String *)&str);
    std::__cxx11::string::~string((string *)&str);
    break;
  case stringValue:
    local_99 = Value::getString(local_18,&end,&stack0xffffffffffffff68);
    if ((bool)local_99) {
      valueToQuotedStringN_abi_cxx11_
                (&local_c0,(Json *)end,pcStack_98 + -(long)end,
                 (ulong)((byte)this->field_0xd8 >> 3 & 1),SUB41(in_R8D,0));
      pushValue(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"",&local_e1);
      pushValue(this,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    break;
  case booleanValue:
    bVar1 = Value::asBool(local_18);
    __return_storage_ptr__ =
         &members.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    valueToString_abi_cxx11_((String *)__return_storage_ptr__,(Json *)(ulong)bVar1,value_01);
    pushValue(this,(String *)__return_storage_ptr__);
    std::__cxx11::string::~string
              ((string *)
               &members.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case arrayValue:
    writeArrayValue(this,local_18);
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)local_120,local_18);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_120);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,"{}",&local_141);
      pushValue(this,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"{",(allocator *)((long)&it._M_current + 7))
      ;
      writeWithIndent(this,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      indent(this);
      name = (String *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_120);
      while( true ) {
        childValue = (Value *)__gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&name);
        local_188 = Value::operator[](local_18,(String *)childValue);
        writeCommentBeforeValue(this,local_188);
        pJVar3 = (Json *)std::__cxx11::string::data();
        value_00 = (char *)std::__cxx11::string::length();
        valueToQuotedStringN_abi_cxx11_
                  (&local_1a8,pJVar3,value_00,(ulong)((byte)this->field_0xd8 >> 3 & 1),
                   SUB41(in_R8D,0));
        writeWithIndent(this,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::operator<<((this->super_StreamWriter).sout_,(string *)&this->colonSymbol_);
        writeValue(this,local_188);
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&name);
        local_1b0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_120);
        bVar1 = __gnu_cxx::operator==(__lhs,&local_1b0);
        if (bVar1) break;
        std::operator<<((this->super_StreamWriter).sout_,",");
        writeCommentAfterValueOnSameLine(this,local_188);
      }
      writeCommentAfterValueOnSameLine(this,local_188);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,"}",&local_1d1);
      writeWithIndent(this,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_120);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeValue(Value const& value) {
  switch (value.type()) {
  case nullValue:
    pushValue(nullSymbol_);
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble(), useSpecialFloats_, precision_,
                            precisionType_));
    break;
  case stringValue: {
    // Is NULL is possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      pushValue(
          valueToQuotedStringN(str, static_cast<size_t>(end - str), emitUTF8_));
    else
      pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      auto it = members.begin();
      for (;;) {
        String const& name = *it;
        Value const& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(
            valueToQuotedStringN(name.data(), name.length(), emitUTF8_));
        *sout_ << colonSymbol_;
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}